

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TableSetBgColor(ImGuiTableBgTarget bg_target,ImU32 color,int column_n)

{
  float *pfVar1;
  ImGuiTableCellData *pIVar2;
  int in_EDX;
  ImU32 in_ESI;
  int in_EDI;
  int bg_idx;
  ImGuiTableCellData *cell_data;
  ImGuiTable *table;
  ImGuiContext *g;
  undefined8 in_stack_ffffffffffffffd8;
  int i;
  ImGuiTable *this;
  int local_c;
  ImU32 local_8;
  
  i = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  this = GImGui->CurrentTable;
  if (in_EDI == 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x27a9,"TableSetBgColor","ImGui ASSERT FAILED: %s",
                "bg_target != ImGuiTableBgTarget_None");
  }
  local_8 = in_ESI;
  if (in_ESI == 0x1000000) {
    local_8 = 0;
  }
  if (in_EDI - 3U < 2) {
    pfVar1 = &(this->InnerClipRect).Max.y;
    if (this->RowPosY1 < *pfVar1 || this->RowPosY1 == *pfVar1) {
      if (in_EDX != -1) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                    ,0x27c3,"TableSetBgColor","ImGui ASSERT FAILED: %s","column_n == -1");
      }
      this->RowBgColor[(int)(uint)(in_EDI == 4)] = local_8;
    }
  }
  else if (in_EDI == 5) {
    pfVar1 = &(this->InnerClipRect).Max.y;
    if (this->RowPosY1 < *pfVar1 || this->RowPosY1 == *pfVar1) {
      local_c = in_EDX;
      if (in_EDX == -1) {
        local_c = this->CurrentColumn;
      }
      if ((this->VisibleUnclippedMaskByIndex & 1L << ((byte)local_c & 0x3f)) != 0) {
        this->RowCellDataCount = this->RowCellDataCount + '\x01';
        pIVar2 = ImSpan<ImGuiTableCellData>::operator[]((ImSpan<ImGuiTableCellData> *)this,i);
        pIVar2->BgColor = local_8;
        pIVar2->Column = (byte)local_c;
      }
    }
  }
  else {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x27c9,"TableSetBgColor","ImGui ASSERT FAILED: %s","0");
  }
  return;
}

Assistant:

void ImGui::TableSetBgColor(ImGuiTableBgTarget bg_target, ImU32 color, int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(bg_target != ImGuiTableBgTarget_None);

    if (color == IM_COL32_DISABLE)
        color = 0;

    // We cannot draw neither the cell or row background immediately as we don't know the row height at this point in time.
    switch (bg_target)
    {
    case ImGuiTableBgTarget_CellBg:
    {
        if (table->RowPosY1 > table->InnerClipRect.Max.y) // Discard
            return;
        if (column_n == -1)
            column_n = table->CurrentColumn;
        if ((table->VisibleUnclippedMaskByIndex & ((ImU64)1 << column_n)) == 0)
            return;
        ImGuiTableCellData* cell_data = &table->RowCellData[table->RowCellDataCount++];
        cell_data->BgColor = color;
        cell_data->Column = (ImS8)column_n;
        break;
    }
    case ImGuiTableBgTarget_RowBg0:
    case ImGuiTableBgTarget_RowBg1:
    {
        if (table->RowPosY1 > table->InnerClipRect.Max.y) // Discard
            return;
        IM_ASSERT(column_n == -1);
        int bg_idx = (bg_target == ImGuiTableBgTarget_RowBg1) ? 1 : 0;
        table->RowBgColor[bg_idx] = color;
        break;
    }
    default:
        IM_ASSERT(0);
    }
}